

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OrderedArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedArgumentSyntax,slang::syntax::OrderedArgumentSyntax_const&>
          (BumpAllocator *this,OrderedArgumentSyntax *args)

{
  OrderedArgumentSyntax *pOVar1;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pOVar1 = (OrderedArgumentSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  *(undefined8 *)&(pOVar1->super_ArgumentSyntax).super_SyntaxNode = *in_RSI;
  (pOVar1->super_ArgumentSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RSI[1];
  (pOVar1->super_ArgumentSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)in_RSI[2];
  (pOVar1->expr).ptr = (PropertyExprSyntax *)in_RSI[3];
  return pOVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }